

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O0

nhr_thread nhr_thread_create(nhr_thread_funct thread_function,void *user_object)

{
  int iVar1;
  undefined1 local_68 [8];
  pthread_attr_t attr;
  nhr_thread_funct p_Stack_28;
  int res;
  nhr_thread t;
  void *user_object_local;
  nhr_thread_funct thread_function_local;
  
  p_Stack_28 = (nhr_thread_funct)0x0;
  attr._52_4_ = 0xffffffff;
  if (thread_function == (nhr_thread_funct)0x0) {
    thread_function_local = (nhr_thread_funct)0x0;
  }
  else {
    t = (nhr_thread)user_object;
    user_object_local = thread_function;
    nhr_threads_joiner_create_ifneed();
    p_Stack_28 = (nhr_thread_funct)nhr_malloc_zero(0x18);
    *(nhr_thread *)(p_Stack_28 + 8) = t;
    *(void **)p_Stack_28 = user_object_local;
    iVar1 = pthread_attr_init((pthread_attr_t *)local_68);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setscope((pthread_attr_t *)local_68,0);
      if ((iVar1 == 0) &&
         (iVar1 = pthread_attr_setdetachstate((pthread_attr_t *)local_68,0), iVar1 == 0)) {
        attr._52_4_ = pthread_create((pthread_t *)(p_Stack_28 + 0x10),(pthread_attr_t *)local_68,
                                     nhr_thread_func_priv,p_Stack_28);
      }
      pthread_attr_destroy((pthread_attr_t *)local_68);
    }
    if (attr._52_4_ != 0) {
      __assert_fail("res == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_thread.c"
                    ,0x92,"nhr_thread nhr_thread_create(nhr_thread_funct, void *)");
    }
    thread_function_local = p_Stack_28;
  }
  return (nhr_thread)thread_function_local;
}

Assistant:

nhr_thread nhr_thread_create(nhr_thread_funct thread_function, void * user_object) {
	nhr_thread t = NULL;
	int res = -1;
#if !defined(NHR_OS_WINDOWS)
	pthread_attr_t attr;
#endif

	if (!thread_function) {
		return NULL;
	}
	nhr_threads_joiner_create_ifneed();
	t = (nhr_thread)nhr_malloc_zero(sizeof(struct nhr_thread_struct));
	t->user_object = user_object;
	t->thread_function = thread_function;
#if defined(NHR_OS_WINDOWS)
	t->thread = CreateThread(NULL, 0, &nhr_thread_func_priv, (LPVOID)t, 0, NULL);
	assert(t->thread);
#else
	if (pthread_attr_init(&attr) == 0) {
		if (pthread_attr_setscope(&attr, PTHREAD_SCOPE_SYSTEM) == 0) {
			if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE) == 0) {
				res = pthread_create(&t->thread, &attr, &nhr_thread_func_priv, (void *)t);
			}
		}
		pthread_attr_destroy(&attr);
	}
	assert(res == 0);
#endif
	return t;
}